

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ImageFeatureType_EnumeratedImageSizes * __thiscall
CoreML::Specification::ImageFeatureType::mutable_enumeratedsizes(ImageFeatureType *this)

{
  ImageFeatureType_EnumeratedImageSizes *pIVar1;
  ImageFeatureType_EnumeratedImageSizes *_msg;
  ImageFeatureType *this_local;
  
  pIVar1 = _internal_mutable_enumeratedsizes(this);
  return pIVar1;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes* ImageFeatureType::mutable_enumeratedsizes() {
  ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes* _msg = _internal_mutable_enumeratedsizes();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.enumeratedSizes)
  return _msg;
}